

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayColorDepthAttachments.cpp
# Opt level: O0

bool glcts::verifyImage<unsigned_int,1u>
               (GLuint image_width,GLuint image_height,uint *components,uint *image)

{
  bool bVar1;
  GLuint component;
  GLuint pixel_offset;
  GLuint x;
  GLuint line_offset;
  GLuint y;
  GLuint line_size;
  uint *image_local;
  uint *components_local;
  GLuint image_height_local;
  GLuint image_width_local;
  
  x = 0;
  do {
    if (image_height <= x) {
      return true;
    }
    for (component = 0; component < image_width; component = component + 1) {
      bVar1 = false;
      while (!bVar1) {
        if (image[x * image_width + component] != *components) {
          return false;
        }
        bVar1 = true;
      }
    }
    x = x + 1;
  } while( true );
}

Assistant:

bool verifyImage(glw::GLuint image_width, glw::GLuint image_height, const T* components, const T* image)
{
	const glw::GLuint line_size = image_width * N_Components;

	for (glw::GLuint y = 0; y < image_height; ++y)
	{
		const glw::GLuint line_offset = y * line_size;

		for (glw::GLuint x = 0; x < image_width; ++x)
		{
			const glw::GLuint pixel_offset = line_offset + x * N_Components;

			for (glw::GLuint component = 0; component < N_Components; ++component)
			{
				if (image[pixel_offset + component] != components[component])
				{
					return false;
				}
			} /* for (all components) */
		}	 /* for (all columns) */
	}		  /* for (all rows) */

	return true;
}